

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O3

void __thiscall lattice::supercell::supercell(supercell *this,span_t *span)

{
  (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (long *)0x0;
  (this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (long *)0x0;
  (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->rs_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->rs_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->rs_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (long *)0x0;
  (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  init(this,(EVP_PKEY_CTX *)span);
  return;
}

Assistant:

supercell(const span_t& span) { init(span); }